

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

void __thiscall
slang::ast::SampledValueExprVisitor::visit<slang::ast::SimpleAssignmentPatternExpression>
          (SampledValueExprVisitor *this,SimpleAssignmentPatternExpression *expr)

{
  ExpressionKind EVar1;
  Type *this_00;
  size_t sVar2;
  pointer ppEVar3;
  Expression *this_01;
  bool bVar4;
  KnownSystemName name;
  Symbol *pSVar5;
  Type *pTVar6;
  SourceLocation SVar7;
  SourceLocation SVar8;
  DiagCode code;
  ASTContext *this_02;
  long lVar9;
  CallExpression *call;
  SourceRange sourceRange;
  
  EVar1 = (expr->super_AssignmentPatternExpressionBase).super_Expression.kind;
  if (EVar1 == Call) {
    if (*(char *)&expr[1].super_AssignmentPatternExpressionBase.super_Expression.syntax == '\x01') {
      name = CallExpression::getKnownSystemName((CallExpression *)expr);
      if ((name == Matched) &&
         (expr[1].super_AssignmentPatternExpressionBase.elements_._M_ptr != (pointer)0x0)) {
        this_00 = *(Type **)(*(long *)expr[1].super_AssignmentPatternExpressionBase.super_Expression
                                      .sourceRange.endLoc + 8);
        pTVar6 = this_00->canonical;
        if (pTVar6 == (Type *)0x0) {
          Type::resolveCanonical(this_00);
          pTVar6 = this_00->canonical;
        }
        if ((pTVar6->super_Symbol).kind == SequenceType) {
          ASTContext::addDiag(this->context,this->matchedCode,
                              (expr->super_AssignmentPatternExpressionBase).super_Expression.
                              sourceRange);
        }
      }
      if (this->isFutureGlobal == true) {
        bVar4 = SemanticFacts::isGlobalFutureSampledValueFunc(name);
        if (bVar4) {
          this_02 = this->context;
          SVar8 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.
                  startLoc;
          SVar7 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc;
          code.subsystem = Statements;
          code.code = 0x1d;
          goto LAB_0040058b;
        }
      }
    }
  }
  else if (EVar1 == NamedValue) {
    pSVar5 = Expression::getSymbolReference((Expression *)expr,true);
    if ((pSVar5 != (Symbol *)0x0) &&
       ((pSVar5->kind == LocalAssertionVar ||
        ((pSVar5->kind == AssertionPort && (*(char *)((long)&pSVar5[2].name._M_len + 4) == '\x01')))
        ))) {
      this_02 = this->context;
      code = this->localVarCode;
      SVar8 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc;
      SVar7 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc;
LAB_0040058b:
      sourceRange.endLoc = SVar7;
      sourceRange.startLoc = SVar8;
      ASTContext::addDiag(this_02,code,sourceRange);
      return;
    }
  }
  else {
    sVar2 = (expr->super_AssignmentPatternExpressionBase).elements_._M_extent._M_extent_value;
    if (sVar2 != 0) {
      ppEVar3 = (expr->super_AssignmentPatternExpressionBase).elements_._M_ptr;
      lVar9 = 0;
      do {
        this_01 = *(Expression **)((long)ppEVar3 + lVar9);
        Expression::
        visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
                  (this_01,this_01,this);
        lVar9 = lVar9 + 8;
      } while (sVar2 << 3 != lVar9);
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind == SymbolKind::LocalAssertionVar ||
                            (sym->kind == SymbolKind::AssertionPort &&
                             sym->template as<AssertionPortSymbol>().isLocalVar())) {
                            context.addDiag(localVarCode, expr.sourceRange);
                        }
                    }
                    break;
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.isSystemCall()) {
                        auto ksn = call.getKnownSystemName();
                        if (ksn == KnownSystemName::Matched && !call.arguments().empty() &&
                            call.arguments()[0]->type->isSequenceType()) {
                            context.addDiag(matchedCode, expr.sourceRange);
                        }

                        if (isFutureGlobal && SemanticFacts::isGlobalFutureSampledValueFunc(ksn))
                            context.addDiag(diag::GlobalSampledValueNested, expr.sourceRange);
                    }
                    break;
                }
                default:
                    if constexpr (HasVisitExprs<T, SampledValueExprVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }